

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::_cb
          (stack<c4::yml::Parser::State,_16UL> *this,Callbacks *cb)

{
  void *pvVar1;
  pfn_allocate p_Var2;
  pfn_error p_Var3;
  
  if ((((cb->m_user_data != (this->m_callbacks).m_user_data) ||
       (cb->m_allocate != (this->m_callbacks).m_allocate)) ||
      (cb->m_free != (this->m_callbacks).m_free)) || (cb->m_error != (this->m_callbacks).m_error)) {
    _free(this);
    pvVar1 = cb->m_user_data;
    p_Var2 = cb->m_allocate;
    p_Var3 = cb->m_error;
    (this->m_callbacks).m_free = cb->m_free;
    (this->m_callbacks).m_error = p_Var3;
    (this->m_callbacks).m_user_data = pvVar1;
    (this->m_callbacks).m_allocate = p_Var2;
  }
  return;
}

Assistant:

void stack<T, N>::_cb(Callbacks const& cb)
{
    if(cb != m_callbacks)
    {
        _free();
        m_callbacks = cb;
    }
}